

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

level_type booster::log::logger::string_to_level(string *l)

{
  bool bVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  invalid_argument *in_stack_ffffffffffffffd0;
  level_type local_4;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
  if (bVar1) {
    local_4 = emergency;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
    if (bVar1) {
      local_4 = alert;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
      if (bVar1) {
        local_4 = critical;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
        if (bVar1) {
          local_4 = error;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffb8);
          if (bVar1) {
            local_4 = warning;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                                    ,in_stack_ffffffffffffffb8);
            if (bVar1) {
              local_4 = notice;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                      in_stack_ffffffffffffffb8);
              if (bVar1) {
                local_4 = info;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                        in_stack_ffffffffffffffb8);
                if (!bVar1) {
                  uVar2 = __cxa_allocate_exception(0x30);
                  std::operator+(in_stack_00000008,unaff_retaddr);
                  invalid_argument::invalid_argument
                            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
                  __cxa_throw(uVar2,&invalid_argument::typeinfo,invalid_argument::~invalid_argument)
                  ;
                }
                local_4 = debug;
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

level_type logger::string_to_level(std::string const &l)
	{
		if(l=="emergency") return emergency;
		if(l=="alert") return alert;
		if(l=="critical") return critical;
		if(l=="error") return error;
		if(l=="warning") return warning;
		if(l=="notice") return notice;
		if(l=="info") return info;
		if(l=="debug") return debug;
		throw booster::invalid_argument("Invalig logging level :" + l);
	}